

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall perfetto::internal::TracingMuxerImpl::SweepDeadBackends(TracingMuxerImpl *this)

{
  bool bVar1;
  pointer pRVar2;
  pointer this_00;
  const_iterator local_38;
  _List_node_base *local_30;
  _List_iterator<perfetto::internal::TracingMuxerImpl::RegisteredBackend> local_28;
  iterator next_it;
  _Self local_18;
  iterator it;
  TracingMuxerImpl *this_local;
  
  it._M_node = (_List_node_base *)this;
  local_18._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<perfetto::internal::TracingMuxerImpl::RegisteredBackend,_std::allocator<perfetto::internal::TracingMuxerImpl::RegisteredBackend>_>
       ::begin(&this->dead_backends_);
  while( true ) {
    next_it = std::__cxx11::
              list<perfetto::internal::TracingMuxerImpl::RegisteredBackend,_std::allocator<perfetto::internal::TracingMuxerImpl::RegisteredBackend>_>
              ::end(&this->dead_backends_);
    bVar1 = std::operator!=(&local_18,&next_it);
    if (!bVar1) break;
    local_28._M_node = local_18._M_node;
    local_30 = (_List_node_base *)
               std::_List_iterator<perfetto::internal::TracingMuxerImpl::RegisteredBackend>::
               operator++(&local_28,0);
    pRVar2 = std::_List_iterator<perfetto::internal::TracingMuxerImpl::RegisteredBackend>::
             operator->(&local_18);
    this_00 = std::
              unique_ptr<perfetto::internal::TracingMuxerImpl::ProducerImpl,_std::default_delete<perfetto::internal::TracingMuxerImpl::ProducerImpl>_>
              ::operator->(&pRVar2->producer);
    bVar1 = ProducerImpl::SweepDeadServices(this_00);
    if (bVar1) {
      std::_List_const_iterator<perfetto::internal::TracingMuxerImpl::RegisteredBackend>::
      _List_const_iterator(&local_38,&local_18);
      std::__cxx11::
      list<perfetto::internal::TracingMuxerImpl::RegisteredBackend,_std::allocator<perfetto::internal::TracingMuxerImpl::RegisteredBackend>_>
      ::erase(&this->dead_backends_,local_38);
    }
    local_18._M_node = local_28._M_node;
  }
  return;
}

Assistant:

void TracingMuxerImpl::SweepDeadBackends() {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  for (auto it = dead_backends_.begin(); it != dead_backends_.end();) {
    auto next_it = it;
    next_it++;
    if (it->producer->SweepDeadServices())
      dead_backends_.erase(it);
    it = next_it;
  }
}